

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffclos(fitsfile *fptr,int *status)

{
  int iVar1;
  int *piVar2;
  int zerostatus;
  int tstatus;
  
  _zerostatus = 0x3e700000000;
  if (fptr == (fitsfile *)0x0) {
    *status = 0x73;
    iVar1 = 0x73;
  }
  else if (fptr->Fptr->validcode == 0x22b) {
    piVar2 = status;
    if (0 < *status) {
      piVar2 = &tstatus;
    }
    ffchdu(fptr,piVar2);
    piVar2 = &fptr->Fptr->open_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      ffflsh(fptr,1,status);
      iVar1 = (*driverTable[fptr->Fptr->driver].close)(fptr->Fptr->filehandle);
      if ((iVar1 != 0) && (*status < 1)) {
        *status = 0x6e;
        ffpmsg("failed to close the following file: (ffclos)");
        ffpmsg(fptr->Fptr->filename);
      }
      fits_clear_Fptr(fptr->Fptr,status);
      free(fptr->Fptr->iobuffer);
      free(fptr->Fptr->headstart);
      free(fptr->Fptr->filename);
      free(fptr->Fptr);
    }
    else {
      piVar2 = &zerostatus;
      if (*status < 1) {
        piVar2 = status;
      }
      ffflsh(fptr,0,piVar2);
    }
    free(fptr);
    iVar1 = *status;
  }
  else {
    *status = 0x72;
    iVar1 = 0x72;
  }
  return iVar1;
}

Assistant:

int ffclos(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  close the FITS file by completing the current HDU, flushing it to disk,
  then calling the system dependent routine to physically close the FITS file
*/   
{
    int tstatus = NO_CLOSE_ERROR, zerostatus = 0;

    if (!fptr)
        return(*status = NULL_INPUT_PTR);
    else if ((fptr->Fptr)->validcode != VALIDSTRUC) /* check for magic value */
        return(*status = BAD_FILEPTR); 

    /* close and flush the current HDU */
    if (*status > 0)
       ffchdu(fptr, &tstatus);  /* turn off the error message from ffchdu */
    else
       ffchdu(fptr, status);         

    ((fptr->Fptr)->open_count)--;           /* decrement usage counter */

    if ((fptr->Fptr)->open_count == 0)  /* if no other files use structure */
    {
        ffflsh(fptr, TRUE, status);   /* flush and disassociate IO buffers */

        /* call driver function to actually close the file */
        if ((*driverTable[(fptr->Fptr)->driver].close)((fptr->Fptr)->filehandle))
        {
            if (*status <= 0)
            {
              *status = FILE_NOT_CLOSED;  /* report if no previous error */

              ffpmsg("failed to close the following file: (ffclos)");
              ffpmsg((fptr->Fptr)->filename);
            }
        }

        fits_clear_Fptr( fptr->Fptr, status);  /* clear Fptr address */
        free((fptr->Fptr)->iobuffer);    /* free memory for I/O buffers */
        free((fptr->Fptr)->headstart);    /* free memory for headstart array */
        free((fptr->Fptr)->filename);     /* free memory for the filename */
        (fptr->Fptr)->filename = 0;
        (fptr->Fptr)->validcode = 0; /* magic value to indicate invalid fptr */
        free(fptr->Fptr);         /* free memory for the FITS file structure */
        free(fptr);               /* free memory for the FITS file structure */
    }
    else
    {
        /*
           to minimize the fallout from any previous error (e.g., trying to 
           open a non-existent extension in a already opened file), 
           always call ffflsh with status = 0.
        */
        /* just flush the buffers, don't disassociate them */
        if (*status > 0)
            ffflsh(fptr, FALSE, &zerostatus); 
        else
            ffflsh(fptr, FALSE, status); 

        free(fptr);               /* free memory for the FITS file structure */
    }

    return(*status);
}